

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::FileOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  ulong uVar3;
  _func_int **pp_Var4;
  MessageLite *from_msg_00;
  string *psVar5;
  FeatureSet *pFVar6;
  size_type sVar7;
  Arena *pAVar8;
  undefined8 uVar9;
  char *pcVar10;
  Arena *arena;
  FileOptions *_this;
  FileOptions *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  _this = (FileOptions *)to_msg;
  local_28[0] = (FileOptions *)from_msg;
  psVar5 = absl::lts_20240722::log_internal::
           Check_NEImpl<google::protobuf::FileOptions_const*,google::protobuf::FileOptions*>
                     (local_28,&_this,"&from != _this");
  if (psVar5 != (string *)0x0) {
    pcVar10 = (psVar5->_M_dataplus)._M_p;
    sVar7 = psVar5->_M_string_length;
    uVar9 = 0x2283;
LAB_00204f35:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.pb.cc"
               ,uVar9,sVar7,pcVar10);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            (&(_this->field_0)._impl_.uninterpreted_option_,
             (RepeatedPtrField<google::protobuf::UninterpretedOption> *)(from_msg + 3));
  uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      uVar3 = from_msg[4]._internal_metadata_.ptr_;
      pHVar1 = &(_this->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 1;
      pAVar8 = (Arena *)(_this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(_this->field_0)._impl_.java_package_,(string *)(uVar3 & 0xfffffffffffffffc),
                 pAVar8);
    }
    if ((uVar2 & 2) != 0) {
      pp_Var4 = from_msg[5]._vptr_MessageLite;
      pHVar1 = &(_this->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 2;
      pAVar8 = (Arena *)(_this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(_this->field_0)._impl_.java_outer_classname_,
                 (string *)((ulong)pp_Var4 & 0xfffffffffffffffc),pAVar8);
    }
    if ((uVar2 & 4) != 0) {
      uVar3 = from_msg[5]._internal_metadata_.ptr_;
      pHVar1 = &(_this->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 4;
      pAVar8 = (Arena *)(_this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(_this->field_0)._impl_.go_package_,(string *)(uVar3 & 0xfffffffffffffffc),pAVar8)
      ;
    }
    if ((uVar2 & 8) != 0) {
      pp_Var4 = from_msg[6]._vptr_MessageLite;
      pHVar1 = &(_this->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 8;
      pAVar8 = (Arena *)(_this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(_this->field_0)._impl_.objc_class_prefix_,
                 (string *)((ulong)pp_Var4 & 0xfffffffffffffffc),pAVar8);
    }
    if ((uVar2 & 0x10) != 0) {
      uVar3 = from_msg[6]._internal_metadata_.ptr_;
      pHVar1 = &(_this->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 0x10;
      pAVar8 = (Arena *)(_this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(_this->field_0)._impl_.csharp_namespace_,(string *)(uVar3 & 0xfffffffffffffffc),
                 pAVar8);
    }
    if ((uVar2 & 0x20) != 0) {
      pp_Var4 = from_msg[7]._vptr_MessageLite;
      pHVar1 = &(_this->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 0x20;
      pAVar8 = (Arena *)(_this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(_this->field_0)._impl_.swift_prefix_,
                 (string *)((ulong)pp_Var4 & 0xfffffffffffffffc),pAVar8);
    }
    if ((uVar2 & 0x40) != 0) {
      uVar3 = from_msg[7]._internal_metadata_.ptr_;
      pHVar1 = &(_this->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 0x40;
      pAVar8 = (Arena *)(_this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(_this->field_0)._impl_.php_class_prefix_,(string *)(uVar3 & 0xfffffffffffffffc),
                 pAVar8);
    }
    if ((char)uVar2 < '\0') {
      pp_Var4 = from_msg[8]._vptr_MessageLite;
      pHVar1 = &(_this->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 0x80;
      pAVar8 = (Arena *)(_this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(_this->field_0)._impl_.php_namespace_,
                 (string *)((ulong)pp_Var4 & 0xfffffffffffffffc),pAVar8);
    }
  }
  if ((uVar2 & 0xff00) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      uVar3 = from_msg[8]._internal_metadata_.ptr_;
      pHVar1 = &(_this->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 0x100;
      pAVar8 = (Arena *)(_this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(_this->field_0)._impl_.php_metadata_namespace_,
                 (string *)(uVar3 & 0xfffffffffffffffc),pAVar8);
    }
    if ((uVar2 >> 9 & 1) != 0) {
      pp_Var4 = from_msg[9]._vptr_MessageLite;
      pHVar1 = &(_this->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 0x200;
      pAVar8 = (Arena *)(_this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(_this->field_0)._impl_.ruby_package_,
                 (string *)((ulong)pp_Var4 & 0xfffffffffffffffc),pAVar8);
    }
    if ((uVar2 >> 10 & 1) != 0) {
      from_msg_00 = (MessageLite *)from_msg[9]._internal_metadata_.ptr_;
      if (from_msg_00 == (MessageLite *)0x0) {
        pcVar10 = "from._impl_.features_ != nullptr";
        sVar7 = 0x20;
        uVar9 = 0x22ac;
        goto LAB_00204f35;
      }
      pFVar6 = (_this->field_0)._impl_.features_;
      if (pFVar6 == (FeatureSet *)0x0) {
        pFVar6 = (FeatureSet *)Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,from_msg_00)
        ;
        (_this->field_0)._impl_.features_ = pFVar6;
      }
      else {
        FeatureSet::MergeImpl((MessageLite *)pFVar6,from_msg_00);
      }
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      (_this->field_0)._impl_.java_multiple_files_ = *(bool *)&from_msg[10]._vptr_MessageLite;
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      (_this->field_0)._impl_.java_generate_equals_and_hash_ =
           *(bool *)((long)&from_msg[10]._vptr_MessageLite + 1);
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      (_this->field_0)._impl_.java_string_check_utf8_ =
           *(bool *)((long)&from_msg[10]._vptr_MessageLite + 2);
    }
    if ((uVar2 >> 0xe & 1) != 0) {
      (_this->field_0)._impl_.cc_generic_services_ =
           *(bool *)((long)&from_msg[10]._vptr_MessageLite + 3);
    }
    if ((short)uVar2 < 0) {
      (_this->field_0)._impl_.java_generic_services_ =
           *(bool *)((long)&from_msg[10]._vptr_MessageLite + 4);
    }
  }
  if ((uVar2 & 0xf0000) != 0) {
    if ((uVar2 >> 0x10 & 1) != 0) {
      (_this->field_0)._impl_.py_generic_services_ =
           *(bool *)((long)&from_msg[10]._vptr_MessageLite + 5);
    }
    if ((uVar2 >> 0x11 & 1) != 0) {
      (_this->field_0)._impl_.deprecated_ = *(bool *)((long)&from_msg[10]._vptr_MessageLite + 6);
    }
    if ((uVar2 >> 0x12 & 1) != 0) {
      (_this->field_0)._impl_.optimize_for_ = (int)from_msg[10]._internal_metadata_.ptr_;
    }
    if ((uVar2 >> 0x13 & 1) != 0) {
      (_this->field_0)._impl_.cc_enable_arenas_ =
           *(bool *)((long)&from_msg[10]._internal_metadata_.ptr_ + 4);
    }
  }
  pHVar1 = &(_this->field_0)._impl_._has_bits_;
  pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
  internal::ExtensionSet::MergeFrom
            (&(_this->field_0)._impl_._extensions_,(MessageLite *)&_FileOptions_default_instance_,
             (ExtensionSet *)(from_msg + 1));
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(_this->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void FileOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FileOptions*>(&to_msg);
  auto& from = static_cast<const FileOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _this->_internal_set_java_package(from._internal_java_package());
    }
    if (cached_has_bits & 0x00000002u) {
      _this->_internal_set_java_outer_classname(from._internal_java_outer_classname());
    }
    if (cached_has_bits & 0x00000004u) {
      _this->_internal_set_go_package(from._internal_go_package());
    }
    if (cached_has_bits & 0x00000008u) {
      _this->_internal_set_objc_class_prefix(from._internal_objc_class_prefix());
    }
    if (cached_has_bits & 0x00000010u) {
      _this->_internal_set_csharp_namespace(from._internal_csharp_namespace());
    }
    if (cached_has_bits & 0x00000020u) {
      _this->_internal_set_swift_prefix(from._internal_swift_prefix());
    }
    if (cached_has_bits & 0x00000040u) {
      _this->_internal_set_php_class_prefix(from._internal_php_class_prefix());
    }
    if (cached_has_bits & 0x00000080u) {
      _this->_internal_set_php_namespace(from._internal_php_namespace());
    }
  }
  if (cached_has_bits & 0x0000ff00u) {
    if (cached_has_bits & 0x00000100u) {
      _this->_internal_set_php_metadata_namespace(from._internal_php_metadata_namespace());
    }
    if (cached_has_bits & 0x00000200u) {
      _this->_internal_set_ruby_package(from._internal_ruby_package());
    }
    if (cached_has_bits & 0x00000400u) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ =
            ::google::protobuf::Message::CopyConstruct<::google::protobuf::FeatureSet>(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if (cached_has_bits & 0x00000800u) {
      _this->_impl_.java_multiple_files_ = from._impl_.java_multiple_files_;
    }
    if (cached_has_bits & 0x00001000u) {
      _this->_impl_.java_generate_equals_and_hash_ = from._impl_.java_generate_equals_and_hash_;
    }
    if (cached_has_bits & 0x00002000u) {
      _this->_impl_.java_string_check_utf8_ = from._impl_.java_string_check_utf8_;
    }
    if (cached_has_bits & 0x00004000u) {
      _this->_impl_.cc_generic_services_ = from._impl_.cc_generic_services_;
    }
    if (cached_has_bits & 0x00008000u) {
      _this->_impl_.java_generic_services_ = from._impl_.java_generic_services_;
    }
  }
  if (cached_has_bits & 0x000f0000u) {
    if (cached_has_bits & 0x00010000u) {
      _this->_impl_.py_generic_services_ = from._impl_.py_generic_services_;
    }
    if (cached_has_bits & 0x00020000u) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
    if (cached_has_bits & 0x00040000u) {
      _this->_impl_.optimize_for_ = from._impl_.optimize_for_;
    }
    if (cached_has_bits & 0x00080000u) {
      _this->_impl_.cc_enable_arenas_ = from._impl_.cc_enable_arenas_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(internal_default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}